

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

int __thiscall Liby::Timestamp::compareTo(Timestamp *this,Timestamp *rhs)

{
  Timestamp *rhs_local;
  Timestamp *this_local;
  
  if ((this->tv_).tv_sec < (rhs->tv_).tv_sec) {
    this_local._4_4_ = -1;
  }
  else if ((rhs->tv_).tv_sec < (this->tv_).tv_sec) {
    this_local._4_4_ = 1;
  }
  else if ((this->tv_).tv_usec < (rhs->tv_).tv_usec) {
    this_local._4_4_ = -1;
  }
  else if ((rhs->tv_).tv_usec < (this->tv_).tv_usec) {
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int compareTo(const Timestamp &rhs) const {
        if (rhs.tv_.tv_sec > tv_.tv_sec) {
            return -1;
        } else if (rhs.tv_.tv_sec < tv_.tv_sec) {
            return 1;
        } else {
            if (rhs.tv_.tv_usec > tv_.tv_usec) {
                return -1;
            } else if (rhs.tv_.tv_usec < tv_.tv_usec) {
                return 1;
            } else {
                return 0;
            }
        }
    }